

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx512.cpp
# Opt level: O2

void __thiscall ncnn::Mish_x86_avx512::forward_inplace(Mish_x86_avx512 *this)

{
  Option *in_RDX;
  Mat *in_RSI;
  
  forward_inplace((Mish_x86_avx512 *)
                  ((long)&this->_vptr_Mish_x86_avx512 + (long)this->_vptr_Mish_x86_avx512[-0xb]),
                  in_RSI,in_RDX);
  return;
}

Assistant:

int Mish_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}